

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void ImageColorInvert(Image *image)

{
  uint uVar1;
  int iVar2;
  Color *pCVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    pCVar3 = LoadImageColors(*image);
    iVar4 = 0;
    iVar2 = image->height;
    if (image->height < 1) {
      iVar2 = 0;
    }
    for (; iVar4 != iVar2; iVar4 = iVar4 + 1) {
      uVar1 = image->width;
      uVar5 = 0;
      if (0 < (int)uVar1) {
        uVar5 = (ulong)uVar1;
      }
      lVar6 = (long)(int)(uVar1 * iVar4);
      for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
        pCVar3[lVar6 + uVar7].r = ~pCVar3[lVar6 + uVar7].r;
        pCVar3[lVar6 + uVar7].g = ~pCVar3[lVar6 + uVar7].g;
        pCVar3[lVar6 + uVar7].b = ~pCVar3[lVar6 + uVar7].b;
      }
    }
    iVar2 = image->format;
    free(image->data);
    image->data = pCVar3;
    image->format = 7;
    ImageFormat(image,iVar2);
    return;
  }
  return;
}

Assistant:

void ImageColorInvert(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    Color *pixels = LoadImageColors(*image);

    for (int y = 0; y < image->height; y++)
    {
        for (int x = 0; x < image->width; x++)
        {
            pixels[y*image->width + x].r = 255 - pixels[y*image->width + x].r;
            pixels[y*image->width + x].g = 255 - pixels[y*image->width + x].g;
            pixels[y*image->width + x].b = 255 - pixels[y*image->width + x].b;
        }
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}